

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_timeout(Curl_multi *multi,curltime *expire_time,long *timeout_ms)

{
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Curl_tree *pCVar6;
  timediff_t tVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 uVar11;
  curltime cVar12;
  curltime newer;
  curltime newer_00;
  curltime older;
  
  if ((multi->field_0x279 & 0x10) == 0) {
    if (multi->timetree == (Curl_tree *)0x0) {
      expire_time->tv_sec = 0;
      *(undefined8 *)&expire_time->tv_usec = 0;
      tVar7 = -1;
      goto LAB_00147e2e;
    }
    cVar12 = Curl_now();
    pCVar6 = Curl_splay((curltime)ZEXT816(0),multi->timetree);
    multi->timetree = pCVar6;
    if (pCVar6 == (Curl_tree *)0x0) {
      uVar8 = 0;
      uVar9 = 0;
      iVar10 = 0;
      uVar11 = 0;
    }
    else {
      uVar8 = (undefined4)(pCVar6->key).tv_sec;
      uVar9 = *(undefined4 *)((long)&(pCVar6->key).tv_sec + 4);
      iVar10 = (pCVar6->key).tv_usec;
      uVar11 = *(undefined4 *)&(pCVar6->key).field_0xc;
    }
    *(undefined4 *)&expire_time->tv_sec = uVar8;
    *(undefined4 *)((long)&expire_time->tv_sec + 4) = uVar9;
    expire_time->tv_usec = iVar10;
    *(undefined4 *)&expire_time->field_0xc = uVar11;
    pCVar6 = multi->timetree;
    if (pCVar6 != (Curl_tree *)0x0) {
      uVar2 = (pCVar6->key).tv_sec;
      uVar3 = (pCVar6->key).tv_usec;
      newer.tv_usec = uVar3;
      newer.tv_sec = uVar2;
      newer._12_4_ = 0;
      auVar1 = cVar12._0_12_;
      cVar12._12_4_ = 0;
      cVar12.tv_sec = auVar1._0_8_;
      cVar12.tv_usec = auVar1._8_4_;
      tVar7 = Curl_timediff_us(newer,cVar12);
      if (0 < tVar7) {
        uVar4 = (multi->timetree->key).tv_sec;
        uVar5 = (multi->timetree->key).tv_usec;
        newer_00.tv_usec = uVar5;
        newer_00.tv_sec = uVar4;
        newer_00._12_4_ = 0;
        older._12_4_ = 0;
        older.tv_sec = auVar1._0_8_;
        older.tv_usec = auVar1._8_4_;
        tVar7 = Curl_timediff_ceil(newer_00,older);
        goto LAB_00147e2e;
      }
    }
  }
  tVar7 = 0;
LAB_00147e2e:
  *timeout_ms = tVar7;
  return (CURLMcode)tVar7;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               struct curltime *expire_time,
                               long *timeout_ms)
{
  static const struct curltime tv_zero = {0, 0};

  if(multi->dead) {
    *timeout_ms = 0;
    return CURLM_OK;
  }

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct curltime now = Curl_now();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);
    /* this will not return NULL from a non-emtpy tree, but some compilers
     * are not convinced of that. Analyzers are hard. */
    *expire_time = multi->timetree ? multi->timetree->key : tv_zero;

    /* 'multi->timetree' will be non-NULL here but the compilers sometimes
       yell at us if we assume so */
    if(multi->timetree &&
       Curl_timediff_us(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      timediff_t diff = Curl_timediff_ceil(multi->timetree->key, now);
      /* this should be safe even on 32-bit archs, as we do not use that
         overly long timeouts */
      *timeout_ms = (long)diff;
    }
    else {
      /* 0 means immediately */
      *timeout_ms = 0;
    }
  }
  else {
    *expire_time = tv_zero;
    *timeout_ms = -1;
  }

  return CURLM_OK;
}